

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiGetMemoryCommitment.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::MemoryCommitmentAllocateOnlyTestInstance::iterate
          (TestStatus *__return_storage_ptr__,MemoryCommitmentAllocateOnlyTestInstance *this)

{
  ostringstream *this_00;
  ulong uVar1;
  TestStatus *pTVar2;
  VkDevice pVVar3;
  int iVar4;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *vk;
  DeviceInterface *vk_00;
  int i;
  long lVar5;
  long lVar6;
  VkDeviceSize pCommittedMemoryInBytes;
  VkMemoryAllocateInfo memAllocInfo;
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  VkDeviceSize allocSize [10];
  VkPhysicalDeviceMemoryProperties pMemoryProperties;
  allocator<char> local_469;
  ulong local_468;
  TestStatus *local_460;
  MemoryCommitmentAllocateOnlyTestInstance *local_458;
  VkDevice local_450;
  VkMemoryAllocateInfo local_448;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_428;
  MessageBuilder local_408;
  ulong auStack_288 [10];
  VkPhysicalDeviceMemoryProperties local_238;
  
  local_460 = __return_storage_ptr__;
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  local_450 = Context::getDevice((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  local_458 = this;
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties(&local_238,vk,physicalDevice);
  local_468 = 0;
  for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
    iVar4 = rand();
    auStack_288[lVar5] = (long)(iVar4 % 1000 + 1);
  }
  this_00 = &local_408.m_str;
  lVar5 = 0;
  do {
    if (lVar5 == 0x20) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"Pass",(allocator<char> *)&local_448);
      pTVar2 = local_460;
      tcu::TestStatus::pass(local_460,(string *)&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      return pTVar2;
    }
    if ((local_238.memoryTypes[lVar5].propertyFlags & 0x10) != 0) {
      for (lVar6 = 0; pVVar3 = local_450, lVar6 != 10; lVar6 = lVar6 + 1) {
        local_448.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
        local_448.pNext = (void *)0x0;
        uVar1 = auStack_288[lVar6];
        local_448.memoryTypeIndex = (deUint32)lVar5;
        local_448.allocationSize = uVar1;
        ::vk::allocateMemory
                  ((Move<vk::Handle<(vk::HandleType)7>_> *)&local_428,vk_00,local_450,&local_448,
                   (VkAllocationCallbacks *)0x0);
        (*vk_00->_vptr_DeviceInterface[0xb])
                  (vk_00,pVVar3,local_428.m_data.object.m_internal,&local_468);
        if (local_468 != 0) {
          local_408.m_log = ((local_458->super_TestInstance).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::operator<<((ostream *)this_00,"Warning: Memory commitment not null before binding.");
          tcu::MessageBuilder::operator<<(&local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          if (uVar1 < local_468) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_408,"Fail",&local_469);
            pTVar2 = local_460;
            tcu::TestStatus::fail(local_460,(string *)&local_408);
            std::__cxx11::string::~string((string *)&local_408);
            ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_428);
            return pTVar2;
          }
        }
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_428);
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus MemoryCommitmentAllocateOnlyTestInstance::iterate(void)
{
	const VkPhysicalDevice					physicalDevice			= m_context.getPhysicalDevice();
	const VkDevice							device					= m_context.getDevice();
	const InstanceInterface&				vki						= m_context.getInstanceInterface();
	const DeviceInterface&					vkd						= m_context.getDeviceInterface();
	const VkPhysicalDeviceMemoryProperties	pMemoryProperties		= getPhysicalDeviceMemoryProperties(vki,physicalDevice);
	const VkMemoryPropertyFlags				propertyFlag			= VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT;
	const int								arrayLength				= 10;
	VkDeviceSize							pCommittedMemoryInBytes = 0u;
	VkDeviceSize							allocSize[arrayLength];

	// generating random allocation sizes
	for (int i = 0; i < arrayLength; ++i)
	{
		allocSize[i] = rand() % 1000 + 1;
	}

	for (deUint32 memoryTypeIndex = 0u; memoryTypeIndex < VK_MAX_MEMORY_TYPES; ++memoryTypeIndex) //for memoryTypes
	{
		if((pMemoryProperties.memoryTypes[memoryTypeIndex].propertyFlags & propertyFlag) == propertyFlag) //if supports Lazy allocation
		{
			for (int i = 0; i < arrayLength; ++i)
			{
				const VkMemoryAllocateInfo	memAllocInfo =
				{
					VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	//	VkStructureType		sType
					NULL,									//	const void*			pNext
					allocSize[i],							//	VkDeviceSize		allocationSize
					memoryTypeIndex							//	deUint32			memoryTypeIndex
				};

				Move<VkDeviceMemory> memory = allocateMemory(vkd, device, &memAllocInfo, (const VkAllocationCallbacks*)DE_NULL);

				vkd.getDeviceMemoryCommitment(device, memory.get(), &pCommittedMemoryInBytes);
				if(pCommittedMemoryInBytes != 0)
				{
					tcu::TestLog& log = m_context.getTestContext().getLog();
					log << TestLog::Message << "Warning: Memory commitment not null before binding." << TestLog::EndMessage;
				}
				if(pCommittedMemoryInBytes > allocSize[i])
					return tcu::TestStatus::fail("Fail");

			}
		}
	}
	return tcu::TestStatus::pass("Pass");
}